

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O2

void __thiscall
iDynTree::RevoluteJoint::setAxis
          (RevoluteJoint *this,Axis *revoluteAxis,LinkIndex child,LinkIndex param_3)

{
  Axis local_40;
  
  if (this->link1 == child) {
    iDynTree::Axis::reverse();
  }
  else {
    iDynTree::Transform::operator*((Transform *)&local_40,(Axis *)&this->link1_X_link2_at_rest);
  }
  iDynTree::Axis::operator=(&this->rotation_axis_wrt_link1,&local_40);
  resetAxisBuffers(this);
  return;
}

Assistant:

void RevoluteJoint::setAxis(const Axis &revoluteAxis,
                            const LinkIndex child, const LinkIndex /*parent*/)
{
    if( child == link1 )
    {
        rotation_axis_wrt_link1 = revoluteAxis.reverse();
    }
    else
    {
        assert(child == link2);
        rotation_axis_wrt_link1 = link1_X_link2_at_rest*revoluteAxis;
    }

    this->resetAxisBuffers();
}